

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::lazyComputeWordVectors(FastText *this)

{
  int32_t iVar1;
  DenseMatrix *this_00;
  
  if ((this->wordVectors_)._M_t.
      super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>._M_t
      .super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>.
      super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl != (DenseMatrix *)0x0) {
    return;
  }
  this_00 = (DenseMatrix *)operator_new(0x30);
  iVar1 = Dictionary::nwords((this->dict_).
                             super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  DenseMatrix::DenseMatrix
            (this_00,(long)iVar1,
             (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->dim);
  std::__uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::reset
            ((__uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *)
             &this->wordVectors_,this_00);
  precomputeWordVectors
            (this,(this->wordVectors_)._M_t.
                  super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                  .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl);
  return;
}

Assistant:

void FastText::predict(
    int32_t k,
    const std::vector<int32_t>& words,
    Predictions& predictions,
    real threshold) const {
  if (words.empty()) {
    return;
  }
  Model::State state(args_->dim, dict_->nlabels(), 0);
  if (args_->model != model_name::sup) {
    throw std::invalid_argument("Model needs to be supervised for prediction!");
  }
  model_->predict(words, k, threshold, predictions, state);
}